

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O2

string * __thiscall
duckdb::CompressionExtensionFromType_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,FileCompressionType type)

{
  NotImplementedException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  if ((int)this == 3) {
    pcVar1 = ".zst";
  }
  else {
    if ((int)this != 2) {
      this_00 = (NotImplementedException *)
                __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,type));
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "Compression Extension of file compression type is not implemented",&local_39);
      NotImplementedException::NotImplementedException(this_00,&local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar1 = ".gz";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompressionExtensionFromType(const FileCompressionType type) {
	switch (type) {
	case FileCompressionType::GZIP:
		return ".gz";
	case FileCompressionType::ZSTD:
		return ".zst";
	default:
		throw NotImplementedException("Compression Extension of file compression type is not implemented");
	}
}